

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_true>::uintwide_t<long>
          (uintwide_t<64U,_unsigned_short,_void,_true> *this,long v,
          enable_if_t<(std::is_integral<long>::value_&&_std::is_signed<long>::value)> *p_nullparam)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  array<unsigned_short,_4UL> local_10;
  
  *(undefined8 *)(this->values).super_array<unsigned_short,_4UL>.elems = 0;
  if (v < 0) {
    uVar5 = -v;
    local_10.elems[0] = 0;
    local_10.elems[1] = 0;
    local_10.elems[2] = 0;
    local_10.elems[3] = 0;
    lVar3 = -8;
    do {
      lVar4 = lVar3;
      *(short *)(&stack0xfffffffffffffff8 + lVar4) = (short)uVar5;
      lVar3 = lVar4 + 2;
      if (uVar5 < 0x10000) break;
      uVar5 = uVar5 >> 0x10;
    } while (lVar4 != -2);
    if (lVar3 != 0) {
      memset(&stack0xfffffffffffffffa + lVar4,0,-lVar3);
    }
    *&(this->values).super_array<unsigned_short,_4UL>.elems = local_10.elems;
    lVar3 = 0;
    do {
      puVar1 = (ushort *)((long)(this->values).super_array<unsigned_short,_4UL>.elems + lVar3);
      *puVar1 = ~*puVar1;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 8);
    lVar3 = 0;
    do {
      psVar2 = (short *)((long)(this->values).super_array<unsigned_short,_4UL>.elems + lVar3);
      *psVar2 = *psVar2 + 1;
      if (*psVar2 != 0) {
        return;
      }
      bVar6 = lVar3 != 6;
      lVar3 = lVar3 + 2;
    } while (bVar6);
  }
  else {
    local_10.elems[0] = 0;
    local_10.elems[1] = 0;
    local_10.elems[2] = 0;
    local_10.elems[3] = 0;
    if (v == 0) {
      lVar3 = 0;
    }
    else {
      lVar4 = 0;
      do {
        *(short *)((long)local_10.elems + lVar4) = (short)v;
        lVar3 = lVar4 + 2;
        if ((ulong)v < 0x10000) break;
        v = (ulong)v >> 0x10;
        bVar6 = lVar4 != 6;
        lVar4 = lVar3;
      } while (bVar6);
    }
    if (lVar3 != 8) {
      memset((void *)((long)local_10.elems + lVar3),0,8 - lVar3);
    }
    *&(this->values).super_array<unsigned_short,_4UL>.elems = local_10.elems;
  }
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }